

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O1

int test_xmlreader(void)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  int iVar55;
  int iVar56;
  int iVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  int iVar71;
  int iVar72;
  int iVar73;
  xmlParserInputBufferPtr pxVar74;
  undefined8 uVar75;
  size_t sVar76;
  xmlTextReaderPtr pxVar77;
  xmlDocPtr pxVar78;
  long lVar79;
  xmlNodePtr pxVar80;
  ulong uVar81;
  undefined8 uVar82;
  undefined8 uVar83;
  int n_options_2;
  uint uVar84;
  ulong *puVar85;
  undefined4 *puVar86;
  uint *puVar87;
  int n_URI_1;
  uint uVar88;
  ulong in_RSI;
  ulong uVar89;
  char *__s;
  char *__s_00;
  int n_namespaceURI;
  undefined8 *puVar90;
  int n_options_3;
  int test_ret_10;
  int n_URI;
  uint uVar91;
  undefined4 uVar92;
  uint uVar93;
  int test_ret;
  int test_ret_1;
  int test_ret_9;
  int test_ret_18;
  int test_ret_3;
  int test_ret_64;
  int test_ret_63;
  int test_ret_2;
  int test_ret_6;
  int test_ret_5;
  int test_ret_4;
  int local_80;
  int local_74;
  int local_5c;
  int local_48;
  int local_40;
  int local_3c;
  
  if (quiet == '\0') {
    puts("Testing xmlreader : 76 of 86 functions ...");
  }
  iVar1 = 0;
  uVar88 = 0;
  do {
    puVar85 = &DAT_00165d90;
    uVar89 = 0;
    do {
      iVar5 = (int)in_RSI;
      iVar4 = xmlMemBlocks();
      pxVar74 = gen_xmlParserInputBufferPtr(uVar88,iVar5);
      uVar91 = (uint)uVar89;
      if (uVar91 < 7) {
        in_RSI = *puVar85;
      }
      else {
        in_RSI = 0;
      }
      uVar75 = xmlNewTextReader(pxVar74);
      xmlFreeTextReader(uVar75);
      call_tests = call_tests + 1;
      xmlFreeParserInputBuffer(pxVar74);
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar4 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNewTextReader",(ulong)(uint)(iVar5 - iVar4));
        iVar1 = iVar1 + 1;
        printf(" %d",(ulong)uVar88);
        printf(" %d");
        putchar(10);
        in_RSI = uVar89;
      }
      uVar91 = uVar91 + 1;
      uVar89 = (ulong)uVar91;
      puVar85 = puVar85 + 1;
    } while (uVar91 != 8);
    uVar88 = uVar88 + 1;
  } while (uVar88 != 8);
  function_tests = function_tests + 1;
  puVar90 = &DAT_00165d90;
  uVar88 = 0;
  local_74 = 0;
  do {
    iVar4 = xmlMemBlocks();
    if (uVar88 < 7) {
      uVar75 = *puVar90;
    }
    else {
      uVar75 = 0;
    }
    xmlNewTextReaderFilename(uVar75);
    xmlFreeTextReader();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar4 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNewTextReaderFilename",(ulong)(uint)(iVar5 - iVar4));
      local_74 = local_74 + 1;
      printf(" %d",(ulong)uVar88);
      putchar(10);
    }
    uVar88 = uVar88 + 1;
    puVar90 = puVar90 + 1;
  } while (uVar88 != 8);
  function_tests = function_tests + 1;
  local_48 = 0;
  uVar88 = 0;
  do {
    uVar89 = 0;
    do {
      uVar81 = 0;
      do {
        iVar4 = 0;
        do {
          iVar5 = xmlMemBlocks();
          if (uVar88 < 4) {
            uVar75 = (&DAT_00165d70)[uVar88];
          }
          else {
            uVar75 = 0;
          }
          if ((uint)uVar89 < 7) {
            uVar82 = (&DAT_00165d90)[uVar89];
          }
          else {
            uVar82 = 0;
          }
          if ((uint)uVar81 < 3) {
            uVar83 = (&DAT_00165d58)[uVar81];
          }
          else {
            uVar83 = 0;
          }
          xmlReaderForDoc(uVar75,uVar82,uVar83);
          xmlFreeTextReader();
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar6 = xmlMemBlocks();
          if (iVar5 != iVar6) {
            iVar6 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlReaderForDoc",(ulong)(uint)(iVar6 - iVar5));
            local_48 = local_48 + 1;
            printf(" %d",(ulong)uVar88);
            printf(" %d",uVar89);
            printf(" %d",uVar81);
            printf(" %d");
            putchar(10);
          }
          iVar4 = iVar4 + 1;
        } while (iVar4 != 5);
        uVar91 = (uint)uVar81 + 1;
        uVar81 = (ulong)uVar91;
      } while (uVar91 != 4);
      uVar91 = (uint)uVar89 + 1;
      uVar89 = (ulong)uVar91;
    } while (uVar91 != 8);
    uVar88 = uVar88 + 1;
  } while (uVar88 != 5);
  function_tests = function_tests + 1;
  local_5c = 0;
  uVar88 = 0;
  do {
    uVar89 = 0;
    do {
      uVar91 = 0;
      puVar86 = &DAT_00163444;
      do {
        iVar4 = xmlMemBlocks();
        if (uVar88 < 7) {
          uVar75 = (&DAT_00165d90)[uVar88];
        }
        else {
          uVar75 = 0;
        }
        if ((uint)uVar89 < 3) {
          uVar82 = (&DAT_00165d58)[uVar89];
        }
        else {
          uVar82 = 0;
        }
        uVar92 = 0x200;
        if (uVar91 < 4) {
          uVar92 = *puVar86;
        }
        xmlReaderForFile(uVar75,uVar82,uVar92);
        xmlFreeTextReader();
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar5 = xmlMemBlocks();
        if (iVar4 != iVar5) {
          iVar5 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlReaderForFile",(ulong)(uint)(iVar5 - iVar4));
          local_5c = local_5c + 1;
          printf(" %d",(ulong)uVar88);
          printf(" %d",uVar89);
          printf(" %d");
          putchar(10);
        }
        uVar91 = uVar91 + 1;
        puVar86 = puVar86 + 1;
      } while (uVar91 != 5);
      uVar91 = (uint)uVar89 + 1;
      uVar89 = (ulong)uVar91;
    } while (uVar91 != 4);
    uVar88 = uVar88 + 1;
  } while (uVar88 != 8);
  function_tests = function_tests + 1;
  iVar4 = 0;
  iVar5 = 0;
  do {
    uVar88 = 0;
    do {
      uVar89 = 0;
      do {
        uVar81 = 0;
        do {
          pxVar78 = (xmlDocPtr)0x0;
          puVar86 = &DAT_00163444;
          do {
            iVar6 = xmlMemBlocks();
            if (iVar5 == 0) {
              __s_00 = "foo";
LAB_0013e6bf:
              bVar3 = false;
            }
            else {
              if (iVar5 == 2) {
                __s_00 = "test/ent2";
                goto LAB_0013e6bf;
              }
              if (iVar5 == 1) {
                bVar3 = false;
                __s_00 = "<foo/>";
              }
              else {
                bVar3 = true;
                __s_00 = (char *)0x0;
              }
            }
            __s = (char *)0xffffffff;
            if (uVar88 < 4) {
              __s = (char *)(ulong)(uint)(&DAT_00163454)[uVar88];
            }
            if ((uint)uVar89 < 7) {
              uVar75 = (&DAT_00165d90)[uVar89];
            }
            else {
              uVar75 = 0;
            }
            if ((uint)uVar81 < 3) {
              uVar82 = (&DAT_00165d58)[uVar81];
            }
            else {
              uVar82 = 0;
            }
            uVar92 = 0x200;
            uVar91 = (uint)pxVar78;
            if (uVar91 < 4) {
              uVar92 = *puVar86;
            }
            if ((bVar3) || (sVar76 = strlen(__s_00), (int)__s <= (int)sVar76 + 1)) {
              xmlReaderForMemory(__s_00,__s,uVar75,uVar82,uVar92);
              xmlFreeTextReader();
              call_tests = call_tests + 1;
              xmlResetLastError();
              iVar7 = xmlMemBlocks();
              if (iVar6 != iVar7) {
                iVar7 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlReaderForMemory",(ulong)(uint)(iVar7 - iVar6))
                ;
                iVar4 = iVar4 + 1;
                printf(" %d",iVar5);
                printf(" %d",(ulong)uVar88);
                printf(" %d",uVar89);
                printf(" %d",uVar81);
                printf(" %d");
                putchar(10);
                __s = (char *)pxVar78;
              }
            }
            uVar91 = uVar91 + 1;
            pxVar78 = (xmlDocPtr)(ulong)uVar91;
            puVar86 = puVar86 + 1;
          } while (uVar91 != 5);
          uVar91 = (uint)uVar81 + 1;
          uVar81 = (ulong)uVar91;
        } while (uVar91 != 4);
        uVar91 = (uint)uVar89 + 1;
        uVar89 = (ulong)uVar91;
      } while (uVar91 != 8);
      uVar88 = uVar88 + 1;
    } while (uVar88 != 4);
    iVar5 = iVar5 + 1;
    if (iVar5 == 4) {
      function_tests = function_tests + 1;
      local_3c = 0;
      uVar88 = 0;
      do {
        uVar91 = 0;
        do {
          uVar89 = 0;
          do {
            uVar81 = 0;
            do {
              pxVar78 = (xmlDocPtr)0x0;
              puVar86 = &DAT_00163444;
              do {
                iVar6 = (int)__s;
                iVar5 = xmlMemBlocks();
                pxVar77 = gen_xmlTextReaderPtr(uVar88,iVar6);
                if (uVar91 < 4) {
                  __s = (char *)(&DAT_00165d70)[uVar91];
                }
                else {
                  __s = (char *)0x0;
                }
                if ((uint)uVar89 < 7) {
                  uVar75 = (&DAT_00165d90)[uVar89];
                }
                else {
                  uVar75 = 0;
                }
                if ((uint)uVar81 < 3) {
                  uVar82 = (&DAT_00165d58)[uVar81];
                }
                else {
                  uVar82 = 0;
                }
                uVar92 = 0x200;
                uVar84 = (uint)pxVar78;
                if (uVar84 < 4) {
                  uVar92 = *puVar86;
                }
                xmlReaderNewDoc(pxVar77,__s,uVar75,uVar82,uVar92);
                call_tests = call_tests + 1;
                if (pxVar77 != (xmlTextReaderPtr)0x0) {
                  xmlFreeTextReader(pxVar77);
                }
                xmlResetLastError();
                iVar6 = xmlMemBlocks();
                if (iVar5 != iVar6) {
                  iVar6 = xmlMemBlocks();
                  printf("Leak of %d blocks found in xmlReaderNewDoc",(ulong)(uint)(iVar6 - iVar5));
                  local_3c = local_3c + 1;
                  printf(" %d",(ulong)uVar88);
                  printf(" %d",(ulong)uVar91);
                  printf(" %d",uVar89);
                  printf(" %d",uVar81);
                  printf(" %d");
                  putchar(10);
                  __s = (char *)pxVar78;
                }
                uVar84 = uVar84 + 1;
                pxVar78 = (xmlDocPtr)(ulong)uVar84;
                puVar86 = puVar86 + 1;
              } while (uVar84 != 5);
              uVar84 = (uint)uVar81 + 1;
              uVar81 = (ulong)uVar84;
            } while (uVar84 != 4);
            uVar84 = (uint)uVar89 + 1;
            uVar89 = (ulong)uVar84;
          } while (uVar84 != 8);
          uVar91 = uVar91 + 1;
        } while (uVar91 != 5);
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      iVar1 = local_74 + iVar1 + local_48 + local_5c;
      function_tests = function_tests + 1;
      local_40 = 0;
      uVar88 = 0;
      do {
        uVar91 = 0;
        do {
          uVar89 = 0;
          do {
            puVar86 = &DAT_00163444;
            pxVar78 = (xmlDocPtr)0x0;
            do {
              iVar6 = (int)__s;
              iVar5 = xmlMemBlocks();
              pxVar77 = gen_xmlTextReaderPtr(uVar88,iVar6);
              if (uVar91 < 7) {
                __s = (char *)(&DAT_00165d90)[uVar91];
              }
              else {
                __s = (char *)0x0;
              }
              if ((uint)uVar89 < 3) {
                uVar75 = (&DAT_00165d58)[uVar89];
              }
              else {
                uVar75 = 0;
              }
              uVar92 = 0x200;
              uVar84 = (uint)pxVar78;
              if (uVar84 < 4) {
                uVar92 = *puVar86;
              }
              xmlReaderNewFile(pxVar77,__s,uVar75,uVar92);
              call_tests = call_tests + 1;
              if (pxVar77 != (xmlTextReaderPtr)0x0) {
                xmlFreeTextReader(pxVar77);
              }
              xmlResetLastError();
              iVar6 = xmlMemBlocks();
              if (iVar5 != iVar6) {
                iVar6 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlReaderNewFile",(ulong)(uint)(iVar6 - iVar5));
                local_40 = local_40 + 1;
                printf(" %d",(ulong)uVar88);
                printf(" %d",(ulong)uVar91);
                printf(" %d",uVar89);
                printf(" %d");
                putchar(10);
                __s = (char *)pxVar78;
              }
              uVar84 = uVar84 + 1;
              pxVar78 = (xmlDocPtr)(ulong)uVar84;
              puVar86 = puVar86 + 1;
            } while (uVar84 != 5);
            uVar84 = (uint)uVar89 + 1;
            uVar89 = (ulong)uVar84;
          } while (uVar84 != 4);
          uVar91 = uVar91 + 1;
        } while (uVar91 != 8);
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      function_tests = function_tests + 1;
      local_5c = 0;
      uVar88 = 0;
      do {
        uVar91 = 0;
        do {
          uVar89 = 0;
          do {
            uVar81 = 0;
            do {
              uVar84 = 0;
              do {
                uVar93 = 0;
                do {
                  iVar6 = (int)__s;
                  iVar5 = xmlMemBlocks();
                  pxVar77 = gen_xmlTextReaderPtr(uVar88,iVar6);
                  if (uVar91 == 0) {
                    bVar3 = false;
                    __s = "foo";
                  }
                  else if (uVar91 == 2) {
                    bVar3 = false;
                    __s = "test/ent2";
                  }
                  else if (uVar91 == 1) {
                    bVar3 = false;
                    __s = "<foo/>";
                  }
                  else {
                    bVar3 = true;
                    __s = (char *)0x0;
                  }
                  iVar6 = -1;
                  if ((uint)uVar89 < 4) {
                    iVar6 = (&DAT_00163454)[uVar89];
                  }
                  if ((bVar3) || (sVar76 = strlen(__s), iVar6 <= (int)sVar76 + 1)) {
                    xmlReaderNewMemory();
                    call_tests = call_tests + 1;
                    if (pxVar77 != (xmlTextReaderPtr)0x0) {
                      xmlFreeTextReader(pxVar77);
                    }
                    xmlResetLastError();
                    iVar6 = xmlMemBlocks();
                    if (iVar5 != iVar6) {
                      iVar6 = xmlMemBlocks();
                      printf("Leak of %d blocks found in xmlReaderNewMemory",
                             (ulong)(uint)(iVar6 - iVar5));
                      local_5c = local_5c + 1;
                      printf(" %d",(ulong)uVar88);
                      printf(" %d",(ulong)uVar91);
                      printf(" %d",uVar89);
                      printf(" %d",uVar81);
                      printf(" %d",(ulong)uVar84);
                      __s = (char *)(ulong)uVar93;
                      printf(" %d");
                      putchar(10);
                    }
                  }
                  uVar93 = uVar93 + 1;
                } while (uVar93 != 5);
                uVar84 = uVar84 + 1;
              } while (uVar84 != 4);
              uVar84 = (int)uVar81 + 1;
              uVar81 = (ulong)uVar84;
            } while (uVar84 != 8);
            uVar84 = (uint)uVar89 + 1;
            uVar89 = (ulong)uVar84;
          } while (uVar84 != 4);
          uVar91 = uVar91 + 1;
        } while (uVar91 != 4);
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      function_tests = function_tests + 1;
      iVar5 = 0;
      uVar88 = 0;
      do {
        uVar91 = 0;
        do {
          iVar7 = (int)__s;
          iVar6 = xmlMemBlocks();
          pxVar77 = gen_xmlTextReaderPtr(uVar88,iVar7);
          pxVar78 = gen_xmlDocPtr(uVar91,iVar7);
          __s = (char *)pxVar78;
          xmlReaderNewWalker(pxVar77);
          call_tests = call_tests + 1;
          if (pxVar77 != (xmlTextReaderPtr)0x0) {
            xmlFreeTextReader(pxVar77);
          }
          if (((pxVar78 != (xmlDocPtr)0x0) && (api_doc != pxVar78)) && (pxVar78->doc != api_doc)) {
            xmlFreeDoc(pxVar78);
          }
          xmlResetLastError();
          iVar7 = xmlMemBlocks();
          if (iVar6 != iVar7) {
            iVar7 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlReaderNewWalker",(ulong)(uint)(iVar7 - iVar6));
            iVar5 = iVar5 + 1;
            printf(" %d",(ulong)uVar88);
            __s = (char *)(ulong)uVar91;
            printf(" %d");
            putchar(10);
          }
          uVar91 = uVar91 + 1;
        } while (uVar91 != 4);
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      function_tests = function_tests + 1;
      uVar88 = 0;
      iVar6 = 0;
      do {
        iVar7 = xmlMemBlocks();
        pxVar78 = gen_xmlDocPtr(uVar88,(int)__s);
        uVar75 = xmlReaderWalker(pxVar78);
        xmlFreeTextReader(uVar75);
        call_tests = call_tests + 1;
        if (((pxVar78 != (xmlDocPtr)0x0) && (api_doc != pxVar78)) && (pxVar78->doc != api_doc)) {
          xmlFreeDoc(pxVar78);
        }
        xmlResetLastError();
        iVar8 = xmlMemBlocks();
        if (iVar7 != iVar8) {
          iVar8 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlReaderWalker",(ulong)(uint)(iVar8 - iVar7));
          iVar6 = iVar6 + 1;
          __s = (char *)(ulong)uVar88;
          printf(" %d");
          putchar(10);
        }
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      function_tests = function_tests + 1;
      uVar88 = 0;
      iVar7 = 0;
      do {
        iVar8 = xmlMemBlocks();
        pxVar77 = gen_xmlTextReaderPtr(uVar88,(int)__s);
        xmlTextReaderAttributeCount(pxVar77);
        call_tests = call_tests + 1;
        if (pxVar77 != (xmlTextReaderPtr)0x0) {
          xmlFreeTextReader(pxVar77);
        }
        xmlResetLastError();
        iVar9 = xmlMemBlocks();
        if (iVar8 != iVar9) {
          iVar9 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderAttributeCount",
                 (ulong)(uint)(iVar9 - iVar8));
          iVar7 = iVar7 + 1;
          __s = (char *)(ulong)uVar88;
          printf(" %d");
          putchar(10);
        }
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      function_tests = function_tests + 1;
      uVar88 = 0;
      iVar8 = 0;
      do {
        iVar9 = xmlMemBlocks();
        pxVar77 = gen_xmlTextReaderPtr(uVar88,(int)__s);
        lVar79 = xmlTextReaderBaseUri(pxVar77);
        if (lVar79 != 0) {
          (*_xmlFree)(lVar79);
        }
        call_tests = call_tests + 1;
        if (pxVar77 != (xmlTextReaderPtr)0x0) {
          xmlFreeTextReader(pxVar77);
        }
        xmlResetLastError();
        iVar10 = xmlMemBlocks();
        if (iVar9 != iVar10) {
          iVar10 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderBaseUri",(ulong)(uint)(iVar10 - iVar9));
          iVar8 = iVar8 + 1;
          __s = (char *)(ulong)uVar88;
          printf(" %d");
          putchar(10);
        }
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      function_tests = function_tests + 1;
      uVar88 = 0;
      iVar9 = 0;
      do {
        iVar10 = xmlMemBlocks();
        pxVar77 = gen_xmlTextReaderPtr(uVar88,(int)__s);
        xmlTextReaderByteConsumed(pxVar77);
        call_tests = call_tests + 1;
        if (pxVar77 != (xmlTextReaderPtr)0x0) {
          xmlFreeTextReader(pxVar77);
        }
        xmlResetLastError();
        iVar11 = xmlMemBlocks();
        if (iVar10 != iVar11) {
          iVar11 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderByteConsumed",
                 (ulong)(uint)(iVar11 - iVar10));
          iVar9 = iVar9 + 1;
          __s = (char *)(ulong)uVar88;
          printf(" %d");
          putchar(10);
        }
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      function_tests = function_tests + 1;
      uVar88 = 0;
      iVar10 = 0;
      do {
        iVar11 = xmlMemBlocks();
        pxVar77 = gen_xmlTextReaderPtr(uVar88,(int)__s);
        xmlTextReaderClose(pxVar77);
        call_tests = call_tests + 1;
        if (pxVar77 != (xmlTextReaderPtr)0x0) {
          xmlFreeTextReader(pxVar77);
        }
        xmlResetLastError();
        iVar12 = xmlMemBlocks();
        if (iVar11 != iVar12) {
          iVar12 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderClose",(ulong)(uint)(iVar12 - iVar11));
          iVar10 = iVar10 + 1;
          __s = (char *)(ulong)uVar88;
          printf(" %d");
          putchar(10);
        }
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      function_tests = function_tests + 1;
      uVar88 = 0;
      iVar11 = 0;
      do {
        iVar12 = xmlMemBlocks();
        pxVar77 = gen_xmlTextReaderPtr(uVar88,(int)__s);
        xmlTextReaderConstBaseUri(pxVar77);
        call_tests = call_tests + 1;
        if (pxVar77 != (xmlTextReaderPtr)0x0) {
          xmlFreeTextReader(pxVar77);
        }
        xmlResetLastError();
        iVar13 = xmlMemBlocks();
        if (iVar12 != iVar13) {
          iVar13 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderConstBaseUri",
                 (ulong)(uint)(iVar13 - iVar12));
          iVar11 = iVar11 + 1;
          __s = (char *)(ulong)uVar88;
          printf(" %d");
          putchar(10);
        }
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      function_tests = function_tests + 1;
      uVar88 = 0;
      iVar12 = 0;
      do {
        iVar13 = xmlMemBlocks();
        pxVar77 = gen_xmlTextReaderPtr(uVar88,(int)__s);
        xmlTextReaderConstEncoding(pxVar77);
        call_tests = call_tests + 1;
        if (pxVar77 != (xmlTextReaderPtr)0x0) {
          xmlFreeTextReader(pxVar77);
        }
        xmlResetLastError();
        iVar14 = xmlMemBlocks();
        if (iVar13 != iVar14) {
          iVar14 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderConstEncoding",
                 (ulong)(uint)(iVar14 - iVar13));
          iVar12 = iVar12 + 1;
          __s = (char *)(ulong)uVar88;
          printf(" %d");
          putchar(10);
        }
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      function_tests = function_tests + 1;
      uVar88 = 0;
      iVar13 = 0;
      do {
        iVar14 = xmlMemBlocks();
        pxVar77 = gen_xmlTextReaderPtr(uVar88,(int)__s);
        xmlTextReaderConstLocalName(pxVar77);
        call_tests = call_tests + 1;
        if (pxVar77 != (xmlTextReaderPtr)0x0) {
          xmlFreeTextReader(pxVar77);
        }
        xmlResetLastError();
        iVar15 = xmlMemBlocks();
        if (iVar14 != iVar15) {
          iVar15 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderConstLocalName",
                 (ulong)(uint)(iVar15 - iVar14));
          iVar13 = iVar13 + 1;
          __s = (char *)(ulong)uVar88;
          printf(" %d");
          putchar(10);
        }
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      function_tests = function_tests + 1;
      uVar88 = 0;
      iVar14 = 0;
      do {
        iVar15 = xmlMemBlocks();
        pxVar77 = gen_xmlTextReaderPtr(uVar88,(int)__s);
        xmlTextReaderConstName(pxVar77);
        call_tests = call_tests + 1;
        if (pxVar77 != (xmlTextReaderPtr)0x0) {
          xmlFreeTextReader(pxVar77);
        }
        xmlResetLastError();
        iVar16 = xmlMemBlocks();
        if (iVar15 != iVar16) {
          iVar16 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderConstName",(ulong)(uint)(iVar16 - iVar15))
          ;
          iVar14 = iVar14 + 1;
          __s = (char *)(ulong)uVar88;
          printf(" %d");
          putchar(10);
        }
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      function_tests = function_tests + 1;
      uVar88 = 0;
      iVar15 = 0;
      do {
        iVar16 = xmlMemBlocks();
        pxVar77 = gen_xmlTextReaderPtr(uVar88,(int)__s);
        xmlTextReaderConstNamespaceUri(pxVar77);
        call_tests = call_tests + 1;
        if (pxVar77 != (xmlTextReaderPtr)0x0) {
          xmlFreeTextReader(pxVar77);
        }
        xmlResetLastError();
        iVar17 = xmlMemBlocks();
        if (iVar16 != iVar17) {
          iVar17 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderConstNamespaceUri",
                 (ulong)(uint)(iVar17 - iVar16));
          iVar15 = iVar15 + 1;
          __s = (char *)(ulong)uVar88;
          printf(" %d");
          putchar(10);
        }
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      function_tests = function_tests + 1;
      uVar88 = 0;
      iVar16 = 0;
      do {
        iVar17 = xmlMemBlocks();
        pxVar77 = gen_xmlTextReaderPtr(uVar88,(int)__s);
        xmlTextReaderConstPrefix(pxVar77);
        call_tests = call_tests + 1;
        if (pxVar77 != (xmlTextReaderPtr)0x0) {
          xmlFreeTextReader(pxVar77);
        }
        xmlResetLastError();
        iVar18 = xmlMemBlocks();
        if (iVar17 != iVar18) {
          iVar18 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderConstPrefix",
                 (ulong)(uint)(iVar18 - iVar17));
          iVar16 = iVar16 + 1;
          __s = (char *)(ulong)uVar88;
          printf(" %d");
          putchar(10);
        }
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      function_tests = function_tests + 1;
      iVar17 = 0;
      uVar88 = 0;
      do {
        puVar90 = &DAT_00165d70;
        pxVar78 = (xmlDocPtr)0x0;
        do {
          iVar19 = (int)__s;
          iVar18 = xmlMemBlocks();
          pxVar77 = gen_xmlTextReaderPtr(uVar88,iVar19);
          uVar91 = (uint)pxVar78;
          if (uVar91 < 4) {
            __s = (char *)*puVar90;
          }
          else {
            __s = (char *)0x0;
          }
          xmlTextReaderConstString(pxVar77);
          call_tests = call_tests + 1;
          if (pxVar77 != (xmlTextReaderPtr)0x0) {
            xmlFreeTextReader(pxVar77);
          }
          xmlResetLastError();
          iVar19 = xmlMemBlocks();
          if (iVar18 != iVar19) {
            iVar19 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlTextReaderConstString",
                   (ulong)(uint)(iVar19 - iVar18));
            iVar17 = iVar17 + 1;
            printf(" %d",(ulong)uVar88);
            printf(" %d");
            putchar(10);
            __s = (char *)pxVar78;
          }
          uVar91 = uVar91 + 1;
          pxVar78 = (xmlDocPtr)(ulong)uVar91;
          puVar90 = puVar90 + 1;
        } while (uVar91 != 5);
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      function_tests = function_tests + 1;
      uVar88 = 0;
      iVar18 = 0;
      do {
        iVar19 = xmlMemBlocks();
        pxVar77 = gen_xmlTextReaderPtr(uVar88,(int)__s);
        xmlTextReaderConstValue(pxVar77);
        call_tests = call_tests + 1;
        if (pxVar77 != (xmlTextReaderPtr)0x0) {
          xmlFreeTextReader(pxVar77);
        }
        xmlResetLastError();
        iVar20 = xmlMemBlocks();
        if (iVar19 != iVar20) {
          iVar20 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderConstValue",(ulong)(uint)(iVar20 - iVar19)
                );
          iVar18 = iVar18 + 1;
          __s = (char *)(ulong)uVar88;
          printf(" %d");
          putchar(10);
        }
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      function_tests = function_tests + 1;
      uVar88 = 0;
      iVar19 = 0;
      do {
        iVar20 = xmlMemBlocks();
        pxVar77 = gen_xmlTextReaderPtr(uVar88,(int)__s);
        xmlTextReaderConstXmlLang(pxVar77);
        call_tests = call_tests + 1;
        if (pxVar77 != (xmlTextReaderPtr)0x0) {
          xmlFreeTextReader(pxVar77);
        }
        xmlResetLastError();
        iVar21 = xmlMemBlocks();
        if (iVar20 != iVar21) {
          iVar21 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderConstXmlLang",
                 (ulong)(uint)(iVar21 - iVar20));
          iVar19 = iVar19 + 1;
          __s = (char *)(ulong)uVar88;
          printf(" %d");
          putchar(10);
        }
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      function_tests = function_tests + 1;
      uVar88 = 0;
      iVar20 = 0;
      do {
        iVar21 = xmlMemBlocks();
        pxVar77 = gen_xmlTextReaderPtr(uVar88,(int)__s);
        xmlTextReaderConstXmlVersion(pxVar77);
        call_tests = call_tests + 1;
        if (pxVar77 != (xmlTextReaderPtr)0x0) {
          xmlFreeTextReader(pxVar77);
        }
        xmlResetLastError();
        iVar22 = xmlMemBlocks();
        if (iVar21 != iVar22) {
          iVar22 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderConstXmlVersion",
                 (ulong)(uint)(iVar22 - iVar21));
          iVar20 = iVar20 + 1;
          __s = (char *)(ulong)uVar88;
          printf(" %d");
          putchar(10);
        }
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      function_tests = function_tests + 1;
      uVar88 = 0;
      iVar21 = 0;
      do {
        iVar22 = xmlMemBlocks();
        pxVar77 = gen_xmlTextReaderPtr(uVar88,(int)__s);
        pxVar78 = (xmlDocPtr)xmlTextReaderCurrentDoc(pxVar77);
        if (api_doc != pxVar78) {
          xmlFreeDoc(pxVar78);
        }
        call_tests = call_tests + 1;
        if (pxVar77 != (xmlTextReaderPtr)0x0) {
          xmlFreeTextReader(pxVar77);
        }
        xmlResetLastError();
        iVar23 = xmlMemBlocks();
        if (iVar22 != iVar23) {
          iVar23 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderCurrentDoc",(ulong)(uint)(iVar23 - iVar22)
                );
          iVar21 = iVar21 + 1;
          __s = (char *)(ulong)uVar88;
          printf(" %d");
          putchar(10);
        }
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      function_tests = function_tests + 1;
      uVar88 = 0;
      iVar22 = 0;
      do {
        iVar23 = xmlMemBlocks();
        pxVar77 = gen_xmlTextReaderPtr(uVar88,(int)__s);
        pxVar80 = (xmlNodePtr)xmlTextReaderCurrentNode(pxVar77);
        desret_xmlNodePtr(pxVar80);
        call_tests = call_tests + 1;
        if (pxVar77 != (xmlTextReaderPtr)0x0) {
          xmlFreeTextReader(pxVar77);
        }
        xmlResetLastError();
        iVar24 = xmlMemBlocks();
        if (iVar23 != iVar24) {
          iVar24 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderCurrentNode",
                 (ulong)(uint)(iVar24 - iVar23));
          iVar22 = iVar22 + 1;
          __s = (char *)(ulong)uVar88;
          printf(" %d");
          putchar(10);
        }
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      function_tests = function_tests + 1;
      uVar88 = 0;
      iVar23 = 0;
      do {
        iVar24 = xmlMemBlocks();
        pxVar77 = gen_xmlTextReaderPtr(uVar88,(int)__s);
        xmlTextReaderDepth(pxVar77);
        call_tests = call_tests + 1;
        if (pxVar77 != (xmlTextReaderPtr)0x0) {
          xmlFreeTextReader(pxVar77);
        }
        xmlResetLastError();
        iVar25 = xmlMemBlocks();
        if (iVar24 != iVar25) {
          iVar25 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderDepth",(ulong)(uint)(iVar25 - iVar24));
          iVar23 = iVar23 + 1;
          __s = (char *)(ulong)uVar88;
          printf(" %d");
          putchar(10);
        }
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      function_tests = function_tests + 1;
      uVar88 = 0;
      iVar24 = 0;
      do {
        iVar25 = xmlMemBlocks();
        pxVar77 = gen_xmlTextReaderPtr(uVar88,(int)__s);
        pxVar80 = (xmlNodePtr)xmlTextReaderExpand(pxVar77);
        desret_xmlNodePtr(pxVar80);
        call_tests = call_tests + 1;
        if (pxVar77 != (xmlTextReaderPtr)0x0) {
          xmlFreeTextReader(pxVar77);
        }
        xmlResetLastError();
        iVar26 = xmlMemBlocks();
        if (iVar25 != iVar26) {
          iVar26 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderExpand",(ulong)(uint)(iVar26 - iVar25));
          iVar24 = iVar24 + 1;
          __s = (char *)(ulong)uVar88;
          printf(" %d");
          putchar(10);
        }
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      function_tests = function_tests + 1;
      iVar25 = 0;
      uVar88 = 0;
      do {
        puVar90 = &DAT_00165d70;
        pxVar78 = (xmlDocPtr)0x0;
        do {
          iVar27 = (int)__s;
          iVar26 = xmlMemBlocks();
          pxVar77 = gen_xmlTextReaderPtr(uVar88,iVar27);
          uVar91 = (uint)pxVar78;
          if (uVar91 < 4) {
            __s = (char *)*puVar90;
          }
          else {
            __s = (char *)0x0;
          }
          lVar79 = xmlTextReaderGetAttribute(pxVar77);
          if (lVar79 != 0) {
            (*_xmlFree)(lVar79);
          }
          call_tests = call_tests + 1;
          if (pxVar77 != (xmlTextReaderPtr)0x0) {
            xmlFreeTextReader(pxVar77);
          }
          xmlResetLastError();
          iVar27 = xmlMemBlocks();
          if (iVar26 != iVar27) {
            iVar27 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlTextReaderGetAttribute",
                   (ulong)(uint)(iVar27 - iVar26));
            iVar25 = iVar25 + 1;
            printf(" %d",(ulong)uVar88);
            printf(" %d");
            putchar(10);
            __s = (char *)pxVar78;
          }
          uVar91 = uVar91 + 1;
          pxVar78 = (xmlDocPtr)(ulong)uVar91;
          puVar90 = puVar90 + 1;
        } while (uVar91 != 5);
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      function_tests = function_tests + 1;
      iVar26 = 0;
      uVar88 = 0;
      do {
        puVar87 = &DAT_00163454;
        pxVar78 = (xmlDocPtr)0x0;
        do {
          iVar28 = (int)__s;
          iVar27 = xmlMemBlocks();
          pxVar77 = gen_xmlTextReaderPtr(uVar88,iVar28);
          __s = (char *)0xffffffff;
          uVar91 = (uint)pxVar78;
          if (uVar91 < 4) {
            __s = (char *)(ulong)*puVar87;
          }
          lVar79 = xmlTextReaderGetAttributeNo(pxVar77);
          if (lVar79 != 0) {
            (*_xmlFree)(lVar79);
          }
          call_tests = call_tests + 1;
          if (pxVar77 != (xmlTextReaderPtr)0x0) {
            xmlFreeTextReader(pxVar77);
          }
          xmlResetLastError();
          iVar28 = xmlMemBlocks();
          if (iVar27 != iVar28) {
            iVar28 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlTextReaderGetAttributeNo",
                   (ulong)(uint)(iVar28 - iVar27));
            iVar26 = iVar26 + 1;
            printf(" %d",(ulong)uVar88);
            printf(" %d");
            putchar(10);
            __s = (char *)pxVar78;
          }
          uVar91 = uVar91 + 1;
          pxVar78 = (xmlDocPtr)(ulong)uVar91;
          puVar87 = puVar87 + 1;
        } while (uVar91 != 4);
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      function_tests = function_tests + 1;
      iVar27 = 0;
      uVar88 = 0;
      do {
        uVar91 = 0;
        do {
          pxVar78 = (xmlDocPtr)0x0;
          puVar90 = &DAT_00165d70;
          do {
            iVar29 = (int)__s;
            iVar28 = xmlMemBlocks();
            pxVar77 = gen_xmlTextReaderPtr(uVar88,iVar29);
            if (uVar91 < 4) {
              __s = (char *)(&DAT_00165d70)[uVar91];
            }
            else {
              __s = (char *)0x0;
            }
            uVar84 = (uint)pxVar78;
            if (uVar84 < 4) {
              uVar75 = *puVar90;
            }
            else {
              uVar75 = 0;
            }
            lVar79 = xmlTextReaderGetAttributeNs(pxVar77,__s,uVar75);
            if (lVar79 != 0) {
              (*_xmlFree)(lVar79);
            }
            call_tests = call_tests + 1;
            if (pxVar77 != (xmlTextReaderPtr)0x0) {
              xmlFreeTextReader(pxVar77);
            }
            xmlResetLastError();
            iVar29 = xmlMemBlocks();
            if (iVar28 != iVar29) {
              iVar29 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlTextReaderGetAttributeNs",
                     (ulong)(uint)(iVar29 - iVar28));
              iVar27 = iVar27 + 1;
              printf(" %d",(ulong)uVar88);
              printf(" %d",(ulong)uVar91);
              printf(" %d");
              putchar(10);
              __s = (char *)pxVar78;
            }
            uVar84 = uVar84 + 1;
            pxVar78 = (xmlDocPtr)(ulong)uVar84;
            puVar90 = puVar90 + 1;
          } while (uVar84 != 5);
          uVar91 = uVar91 + 1;
        } while (uVar91 != 5);
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      function_tests = function_tests + 1;
      iVar29 = 0;
      iVar28 = 0;
      do {
        iVar31 = (int)__s;
        iVar30 = xmlMemBlocks();
        pxVar77 = gen_xmlTextReaderPtr(iVar28,iVar31);
        __s = (char *)0x0;
        xmlTextReaderGetErrorHandler(pxVar77,0,0);
        call_tests = call_tests + 1;
        if (pxVar77 != (xmlTextReaderPtr)0x0) {
          xmlFreeTextReader(pxVar77);
        }
        xmlResetLastError();
        iVar31 = xmlMemBlocks();
        if (iVar30 != iVar31) {
          iVar31 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderGetErrorHandler",
                 (ulong)(uint)(iVar31 - iVar30));
          iVar29 = iVar29 + 1;
          printf(" %d");
          printf(" %d");
          __s = (char *)0x0;
          printf(" %d");
          putchar(10);
        }
        iVar28 = iVar28 + 1;
      } while (iVar28 != 4);
      function_tests = function_tests + 1;
      uVar88 = 0;
      iVar28 = 0;
      do {
        iVar30 = xmlMemBlocks();
        pxVar77 = gen_xmlTextReaderPtr(uVar88,(int)__s);
        xmlTextReaderGetParserColumnNumber(pxVar77);
        call_tests = call_tests + 1;
        if (pxVar77 != (xmlTextReaderPtr)0x0) {
          xmlFreeTextReader(pxVar77);
        }
        xmlResetLastError();
        iVar31 = xmlMemBlocks();
        if (iVar30 != iVar31) {
          iVar31 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderGetParserColumnNumber",
                 (ulong)(uint)(iVar31 - iVar30));
          iVar28 = iVar28 + 1;
          __s = (char *)(ulong)uVar88;
          printf(" %d");
          putchar(10);
        }
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      function_tests = function_tests + 1;
      uVar88 = 0;
      iVar30 = 0;
      do {
        iVar31 = xmlMemBlocks();
        pxVar77 = gen_xmlTextReaderPtr(uVar88,(int)__s);
        xmlTextReaderGetParserLineNumber(pxVar77);
        call_tests = call_tests + 1;
        if (pxVar77 != (xmlTextReaderPtr)0x0) {
          xmlFreeTextReader(pxVar77);
        }
        xmlResetLastError();
        iVar32 = xmlMemBlocks();
        if (iVar31 != iVar32) {
          iVar32 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderGetParserLineNumber",
                 (ulong)(uint)(iVar32 - iVar31));
          iVar30 = iVar30 + 1;
          __s = (char *)(ulong)uVar88;
          printf(" %d");
          putchar(10);
        }
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      function_tests = function_tests + 1;
      iVar31 = 0;
      uVar88 = 0;
      do {
        puVar87 = &DAT_00163454;
        pxVar78 = (xmlDocPtr)0x0;
        do {
          iVar33 = (int)__s;
          iVar32 = xmlMemBlocks();
          pxVar77 = gen_xmlTextReaderPtr(uVar88,iVar33);
          __s = (char *)0xffffffff;
          uVar91 = (uint)pxVar78;
          if (uVar91 < 4) {
            __s = (char *)(ulong)*puVar87;
          }
          xmlTextReaderGetParserProp(pxVar77);
          call_tests = call_tests + 1;
          if (pxVar77 != (xmlTextReaderPtr)0x0) {
            xmlFreeTextReader(pxVar77);
          }
          xmlResetLastError();
          iVar33 = xmlMemBlocks();
          if (iVar32 != iVar33) {
            iVar33 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlTextReaderGetParserProp",
                   (ulong)(uint)(iVar33 - iVar32));
            iVar31 = iVar31 + 1;
            printf(" %d",(ulong)uVar88);
            printf(" %d");
            putchar(10);
            __s = (char *)pxVar78;
          }
          uVar91 = uVar91 + 1;
          pxVar78 = (xmlDocPtr)(ulong)uVar91;
          puVar87 = puVar87 + 1;
        } while (uVar91 != 4);
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      function_tests = function_tests + 1;
      uVar88 = 0;
      iVar32 = 0;
      do {
        iVar33 = xmlMemBlocks();
        pxVar77 = gen_xmlTextReaderPtr(uVar88,(int)__s);
        uVar75 = xmlTextReaderGetRemainder(pxVar77);
        xmlFreeParserInputBuffer(uVar75);
        call_tests = call_tests + 1;
        if (pxVar77 != (xmlTextReaderPtr)0x0) {
          xmlFreeTextReader(pxVar77);
        }
        xmlResetLastError();
        iVar34 = xmlMemBlocks();
        if (iVar33 != iVar34) {
          iVar34 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderGetRemainder",
                 (ulong)(uint)(iVar34 - iVar33));
          iVar32 = iVar32 + 1;
          __s = (char *)(ulong)uVar88;
          printf(" %d");
          putchar(10);
        }
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      function_tests = function_tests + 1;
      uVar88 = 0;
      iVar33 = 0;
      do {
        iVar34 = xmlMemBlocks();
        pxVar77 = gen_xmlTextReaderPtr(uVar88,(int)__s);
        xmlTextReaderHasAttributes(pxVar77);
        call_tests = call_tests + 1;
        if (pxVar77 != (xmlTextReaderPtr)0x0) {
          xmlFreeTextReader(pxVar77);
        }
        xmlResetLastError();
        iVar35 = xmlMemBlocks();
        if (iVar34 != iVar35) {
          iVar35 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderHasAttributes",
                 (ulong)(uint)(iVar35 - iVar34));
          iVar33 = iVar33 + 1;
          __s = (char *)(ulong)uVar88;
          printf(" %d");
          putchar(10);
        }
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      function_tests = function_tests + 1;
      uVar88 = 0;
      iVar34 = 0;
      do {
        iVar35 = xmlMemBlocks();
        pxVar77 = gen_xmlTextReaderPtr(uVar88,(int)__s);
        xmlTextReaderHasValue(pxVar77);
        call_tests = call_tests + 1;
        if (pxVar77 != (xmlTextReaderPtr)0x0) {
          xmlFreeTextReader(pxVar77);
        }
        xmlResetLastError();
        iVar36 = xmlMemBlocks();
        if (iVar35 != iVar36) {
          iVar36 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderHasValue",(ulong)(uint)(iVar36 - iVar35));
          iVar34 = iVar34 + 1;
          __s = (char *)(ulong)uVar88;
          printf(" %d");
          putchar(10);
        }
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      function_tests = function_tests + 1;
      uVar88 = 0;
      iVar35 = 0;
      do {
        iVar36 = xmlMemBlocks();
        pxVar77 = gen_xmlTextReaderPtr(uVar88,(int)__s);
        xmlTextReaderIsDefault(pxVar77);
        call_tests = call_tests + 1;
        if (pxVar77 != (xmlTextReaderPtr)0x0) {
          xmlFreeTextReader(pxVar77);
        }
        xmlResetLastError();
        iVar37 = xmlMemBlocks();
        if (iVar36 != iVar37) {
          iVar37 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderIsDefault",(ulong)(uint)(iVar37 - iVar36))
          ;
          iVar35 = iVar35 + 1;
          __s = (char *)(ulong)uVar88;
          printf(" %d");
          putchar(10);
        }
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      function_tests = function_tests + 1;
      uVar88 = 0;
      iVar36 = 0;
      do {
        iVar37 = xmlMemBlocks();
        pxVar77 = gen_xmlTextReaderPtr(uVar88,(int)__s);
        xmlTextReaderIsEmptyElement(pxVar77);
        call_tests = call_tests + 1;
        if (pxVar77 != (xmlTextReaderPtr)0x0) {
          xmlFreeTextReader(pxVar77);
        }
        xmlResetLastError();
        iVar38 = xmlMemBlocks();
        if (iVar37 != iVar38) {
          iVar38 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderIsEmptyElement",
                 (ulong)(uint)(iVar38 - iVar37));
          iVar36 = iVar36 + 1;
          __s = (char *)(ulong)uVar88;
          printf(" %d");
          putchar(10);
        }
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      function_tests = function_tests + 1;
      uVar88 = 0;
      iVar37 = 0;
      do {
        iVar38 = xmlMemBlocks();
        pxVar77 = gen_xmlTextReaderPtr(uVar88,(int)__s);
        xmlTextReaderIsNamespaceDecl(pxVar77);
        call_tests = call_tests + 1;
        if (pxVar77 != (xmlTextReaderPtr)0x0) {
          xmlFreeTextReader(pxVar77);
        }
        xmlResetLastError();
        iVar39 = xmlMemBlocks();
        if (iVar38 != iVar39) {
          iVar39 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderIsNamespaceDecl",
                 (ulong)(uint)(iVar39 - iVar38));
          iVar37 = iVar37 + 1;
          __s = (char *)(ulong)uVar88;
          printf(" %d");
          putchar(10);
        }
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      function_tests = function_tests + 1;
      uVar88 = 0;
      iVar38 = 0;
      do {
        iVar39 = xmlMemBlocks();
        pxVar77 = gen_xmlTextReaderPtr(uVar88,(int)__s);
        xmlTextReaderIsValid(pxVar77);
        call_tests = call_tests + 1;
        if (pxVar77 != (xmlTextReaderPtr)0x0) {
          xmlFreeTextReader(pxVar77);
        }
        xmlResetLastError();
        iVar40 = xmlMemBlocks();
        if (iVar39 != iVar40) {
          iVar40 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderIsValid",(ulong)(uint)(iVar40 - iVar39));
          iVar38 = iVar38 + 1;
          __s = (char *)(ulong)uVar88;
          printf(" %d");
          putchar(10);
        }
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      function_tests = function_tests + 1;
      uVar88 = 0;
      iVar39 = 0;
      do {
        iVar40 = xmlMemBlocks();
        pxVar77 = gen_xmlTextReaderPtr(uVar88,(int)__s);
        lVar79 = xmlTextReaderLocalName(pxVar77);
        if (lVar79 != 0) {
          (*_xmlFree)(lVar79);
        }
        call_tests = call_tests + 1;
        if (pxVar77 != (xmlTextReaderPtr)0x0) {
          xmlFreeTextReader(pxVar77);
        }
        xmlResetLastError();
        iVar41 = xmlMemBlocks();
        if (iVar40 != iVar41) {
          iVar41 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderLocalName",(ulong)(uint)(iVar41 - iVar40))
          ;
          iVar39 = iVar39 + 1;
          __s = (char *)(ulong)uVar88;
          printf(" %d");
          putchar(10);
        }
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      function_tests = function_tests + 1;
      iVar40 = xmlMemBlocks();
      lVar79 = xmlTextReaderLocatorBaseURI(0);
      if (lVar79 != 0) {
        (*_xmlFree)(lVar79);
      }
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar41 = xmlMemBlocks();
      if (iVar40 != iVar41) {
        xmlMemBlocks();
        printf("Leak of %d blocks found in xmlTextReaderLocatorBaseURI");
        __s = (char *)0x0;
        printf(" %d");
        putchar(10);
      }
      function_tests = function_tests + 1;
      iVar42 = xmlMemBlocks();
      xmlTextReaderLocatorLineNumber(0);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar43 = xmlMemBlocks();
      if (iVar42 != iVar43) {
        xmlMemBlocks();
        printf("Leak of %d blocks found in xmlTextReaderLocatorLineNumber");
        __s = (char *)0x0;
        printf(" %d");
        putchar(10);
      }
      function_tests = function_tests + 1;
      iVar2 = 0;
      uVar88 = 0;
      do {
        uVar91 = 0;
        puVar90 = &DAT_00165d70;
        do {
          iVar45 = (int)__s;
          iVar44 = xmlMemBlocks();
          pxVar77 = gen_xmlTextReaderPtr(uVar88,iVar45);
          if (uVar91 < 4) {
            __s = (char *)*puVar90;
          }
          else {
            __s = (char *)0x0;
          }
          lVar79 = xmlTextReaderLookupNamespace(pxVar77);
          if (lVar79 != 0) {
            (*_xmlFree)(lVar79);
          }
          call_tests = call_tests + 1;
          if (pxVar77 != (xmlTextReaderPtr)0x0) {
            xmlFreeTextReader(pxVar77);
          }
          xmlResetLastError();
          iVar45 = xmlMemBlocks();
          if (iVar44 != iVar45) {
            iVar45 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlTextReaderLookupNamespace",
                   (ulong)(uint)(iVar45 - iVar44));
            iVar2 = iVar2 + 1;
            printf(" %d",(ulong)uVar88);
            __s = (char *)(ulong)uVar91;
            printf(" %d");
            putchar(10);
          }
          uVar91 = uVar91 + 1;
          puVar90 = puVar90 + 1;
        } while (uVar91 != 5);
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      function_tests = function_tests + 1;
      iVar44 = 0;
      uVar88 = 0;
      do {
        puVar90 = &DAT_00165d70;
        uVar91 = 0;
        do {
          iVar46 = (int)__s;
          iVar45 = xmlMemBlocks();
          pxVar77 = gen_xmlTextReaderPtr(uVar88,iVar46);
          if (uVar91 < 4) {
            __s = (char *)*puVar90;
          }
          else {
            __s = (char *)0x0;
          }
          xmlTextReaderMoveToAttribute(pxVar77);
          call_tests = call_tests + 1;
          if (pxVar77 != (xmlTextReaderPtr)0x0) {
            xmlFreeTextReader(pxVar77);
          }
          xmlResetLastError();
          iVar46 = xmlMemBlocks();
          if (iVar45 != iVar46) {
            iVar46 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlTextReaderMoveToAttribute",
                   (ulong)(uint)(iVar46 - iVar45));
            iVar44 = iVar44 + 1;
            printf(" %d",(ulong)uVar88);
            __s = (char *)(ulong)uVar91;
            printf(" %d");
            putchar(10);
          }
          uVar91 = uVar91 + 1;
          puVar90 = puVar90 + 1;
        } while (uVar91 != 5);
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      function_tests = function_tests + 1;
      iVar45 = 0;
      uVar88 = 0;
      do {
        puVar87 = &DAT_00163454;
        uVar91 = 0;
        do {
          iVar47 = (int)__s;
          iVar46 = xmlMemBlocks();
          pxVar77 = gen_xmlTextReaderPtr(uVar88,iVar47);
          __s = (char *)0xffffffff;
          if (uVar91 < 4) {
            __s = (char *)(ulong)*puVar87;
          }
          xmlTextReaderMoveToAttributeNo(pxVar77);
          call_tests = call_tests + 1;
          if (pxVar77 != (xmlTextReaderPtr)0x0) {
            xmlFreeTextReader(pxVar77);
          }
          xmlResetLastError();
          iVar47 = xmlMemBlocks();
          if (iVar46 != iVar47) {
            iVar47 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlTextReaderMoveToAttributeNo",
                   (ulong)(uint)(iVar47 - iVar46));
            iVar45 = iVar45 + 1;
            printf(" %d",(ulong)uVar88);
            __s = (char *)(ulong)uVar91;
            printf(" %d");
            putchar(10);
          }
          uVar91 = uVar91 + 1;
          puVar87 = puVar87 + 1;
        } while (uVar91 != 4);
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      function_tests = function_tests + 1;
      iVar46 = 0;
      uVar88 = 0;
      do {
        uVar91 = 0;
        do {
          pxVar78 = (xmlDocPtr)0x0;
          puVar90 = &DAT_00165d70;
          do {
            iVar48 = (int)__s;
            iVar47 = xmlMemBlocks();
            pxVar77 = gen_xmlTextReaderPtr(uVar88,iVar48);
            if (uVar91 < 4) {
              __s = (char *)(&DAT_00165d70)[uVar91];
            }
            else {
              __s = (char *)0x0;
            }
            uVar84 = (uint)pxVar78;
            if (uVar84 < 4) {
              uVar75 = *puVar90;
            }
            else {
              uVar75 = 0;
            }
            xmlTextReaderMoveToAttributeNs(pxVar77,__s,uVar75);
            call_tests = call_tests + 1;
            if (pxVar77 != (xmlTextReaderPtr)0x0) {
              xmlFreeTextReader(pxVar77);
            }
            xmlResetLastError();
            iVar48 = xmlMemBlocks();
            if (iVar47 != iVar48) {
              iVar48 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlTextReaderMoveToAttributeNs",
                     (ulong)(uint)(iVar48 - iVar47));
              iVar46 = iVar46 + 1;
              printf(" %d",(ulong)uVar88);
              printf(" %d",(ulong)uVar91);
              printf(" %d");
              putchar(10);
              __s = (char *)pxVar78;
            }
            uVar84 = uVar84 + 1;
            pxVar78 = (xmlDocPtr)(ulong)uVar84;
            puVar90 = puVar90 + 1;
          } while (uVar84 != 5);
          uVar91 = uVar91 + 1;
        } while (uVar91 != 5);
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      function_tests = function_tests + 1;
      uVar88 = 0;
      iVar47 = 0;
      do {
        iVar48 = xmlMemBlocks();
        pxVar77 = gen_xmlTextReaderPtr(uVar88,(int)__s);
        xmlTextReaderMoveToElement(pxVar77);
        call_tests = call_tests + 1;
        if (pxVar77 != (xmlTextReaderPtr)0x0) {
          xmlFreeTextReader(pxVar77);
        }
        xmlResetLastError();
        iVar49 = xmlMemBlocks();
        if (iVar48 != iVar49) {
          iVar49 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderMoveToElement",
                 (ulong)(uint)(iVar49 - iVar48));
          iVar47 = iVar47 + 1;
          __s = (char *)(ulong)uVar88;
          printf(" %d");
          putchar(10);
        }
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      function_tests = function_tests + 1;
      uVar88 = 0;
      iVar48 = 0;
      do {
        iVar49 = xmlMemBlocks();
        pxVar77 = gen_xmlTextReaderPtr(uVar88,(int)__s);
        xmlTextReaderMoveToFirstAttribute(pxVar77);
        call_tests = call_tests + 1;
        if (pxVar77 != (xmlTextReaderPtr)0x0) {
          xmlFreeTextReader(pxVar77);
        }
        xmlResetLastError();
        iVar50 = xmlMemBlocks();
        if (iVar49 != iVar50) {
          iVar50 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderMoveToFirstAttribute",
                 (ulong)(uint)(iVar50 - iVar49));
          iVar48 = iVar48 + 1;
          __s = (char *)(ulong)uVar88;
          printf(" %d");
          putchar(10);
        }
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      function_tests = function_tests + 1;
      uVar88 = 0;
      iVar49 = 0;
      do {
        iVar50 = xmlMemBlocks();
        pxVar77 = gen_xmlTextReaderPtr(uVar88,(int)__s);
        xmlTextReaderMoveToNextAttribute(pxVar77);
        call_tests = call_tests + 1;
        if (pxVar77 != (xmlTextReaderPtr)0x0) {
          xmlFreeTextReader(pxVar77);
        }
        xmlResetLastError();
        iVar51 = xmlMemBlocks();
        if (iVar50 != iVar51) {
          iVar51 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderMoveToNextAttribute",
                 (ulong)(uint)(iVar51 - iVar50));
          iVar49 = iVar49 + 1;
          __s = (char *)(ulong)uVar88;
          printf(" %d");
          putchar(10);
        }
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      function_tests = function_tests + 1;
      uVar88 = 0;
      iVar50 = 0;
      do {
        iVar51 = xmlMemBlocks();
        pxVar77 = gen_xmlTextReaderPtr(uVar88,(int)__s);
        lVar79 = xmlTextReaderName(pxVar77);
        if (lVar79 != 0) {
          (*_xmlFree)(lVar79);
        }
        call_tests = call_tests + 1;
        if (pxVar77 != (xmlTextReaderPtr)0x0) {
          xmlFreeTextReader(pxVar77);
        }
        xmlResetLastError();
        iVar52 = xmlMemBlocks();
        if (iVar51 != iVar52) {
          iVar52 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderName",(ulong)(uint)(iVar52 - iVar51));
          iVar50 = iVar50 + 1;
          __s = (char *)(ulong)uVar88;
          printf(" %d");
          putchar(10);
        }
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      function_tests = function_tests + 1;
      uVar88 = 0;
      iVar51 = 0;
      do {
        iVar52 = xmlMemBlocks();
        pxVar77 = gen_xmlTextReaderPtr(uVar88,(int)__s);
        lVar79 = xmlTextReaderNamespaceUri(pxVar77);
        if (lVar79 != 0) {
          (*_xmlFree)(lVar79);
        }
        call_tests = call_tests + 1;
        if (pxVar77 != (xmlTextReaderPtr)0x0) {
          xmlFreeTextReader(pxVar77);
        }
        xmlResetLastError();
        iVar53 = xmlMemBlocks();
        if (iVar52 != iVar53) {
          iVar53 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderNamespaceUri",
                 (ulong)(uint)(iVar53 - iVar52));
          iVar51 = iVar51 + 1;
          __s = (char *)(ulong)uVar88;
          printf(" %d");
          putchar(10);
        }
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      function_tests = function_tests + 1;
      uVar88 = 0;
      iVar52 = 0;
      do {
        iVar53 = xmlMemBlocks();
        pxVar77 = gen_xmlTextReaderPtr(uVar88,(int)__s);
        xmlTextReaderNext(pxVar77);
        call_tests = call_tests + 1;
        if (pxVar77 != (xmlTextReaderPtr)0x0) {
          xmlFreeTextReader(pxVar77);
        }
        xmlResetLastError();
        iVar54 = xmlMemBlocks();
        if (iVar53 != iVar54) {
          iVar54 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderNext",(ulong)(uint)(iVar54 - iVar53));
          iVar52 = iVar52 + 1;
          __s = (char *)(ulong)uVar88;
          printf(" %d");
          putchar(10);
        }
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      function_tests = function_tests + 1;
      uVar88 = 0;
      iVar53 = 0;
      do {
        iVar54 = xmlMemBlocks();
        pxVar77 = gen_xmlTextReaderPtr(uVar88,(int)__s);
        xmlTextReaderNextSibling(pxVar77);
        call_tests = call_tests + 1;
        if (pxVar77 != (xmlTextReaderPtr)0x0) {
          xmlFreeTextReader(pxVar77);
        }
        xmlResetLastError();
        iVar55 = xmlMemBlocks();
        if (iVar54 != iVar55) {
          iVar55 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderNextSibling",
                 (ulong)(uint)(iVar55 - iVar54));
          iVar53 = iVar53 + 1;
          __s = (char *)(ulong)uVar88;
          printf(" %d");
          putchar(10);
        }
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      function_tests = function_tests + 1;
      uVar88 = 0;
      iVar54 = 0;
      do {
        iVar55 = xmlMemBlocks();
        pxVar77 = gen_xmlTextReaderPtr(uVar88,(int)__s);
        xmlTextReaderNodeType(pxVar77);
        call_tests = call_tests + 1;
        if (pxVar77 != (xmlTextReaderPtr)0x0) {
          xmlFreeTextReader(pxVar77);
        }
        xmlResetLastError();
        iVar56 = xmlMemBlocks();
        if (iVar55 != iVar56) {
          iVar56 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderNodeType",(ulong)(uint)(iVar56 - iVar55));
          iVar54 = iVar54 + 1;
          __s = (char *)(ulong)uVar88;
          printf(" %d");
          putchar(10);
        }
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      function_tests = function_tests + 1;
      uVar88 = 0;
      iVar55 = 0;
      do {
        iVar56 = xmlMemBlocks();
        pxVar77 = gen_xmlTextReaderPtr(uVar88,(int)__s);
        xmlTextReaderNormalization(pxVar77);
        call_tests = call_tests + 1;
        if (pxVar77 != (xmlTextReaderPtr)0x0) {
          xmlFreeTextReader(pxVar77);
        }
        xmlResetLastError();
        iVar57 = xmlMemBlocks();
        if (iVar56 != iVar57) {
          iVar57 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderNormalization",
                 (ulong)(uint)(iVar57 - iVar56));
          iVar55 = iVar55 + 1;
          __s = (char *)(ulong)uVar88;
          printf(" %d");
          putchar(10);
        }
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      function_tests = function_tests + 1;
      uVar88 = 0;
      iVar56 = 0;
      do {
        iVar57 = xmlMemBlocks();
        pxVar77 = gen_xmlTextReaderPtr(uVar88,(int)__s);
        lVar79 = xmlTextReaderPrefix(pxVar77);
        if (lVar79 != 0) {
          (*_xmlFree)(lVar79);
        }
        call_tests = call_tests + 1;
        if (pxVar77 != (xmlTextReaderPtr)0x0) {
          xmlFreeTextReader(pxVar77);
        }
        xmlResetLastError();
        iVar58 = xmlMemBlocks();
        if (iVar57 != iVar58) {
          iVar58 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderPrefix",(ulong)(uint)(iVar58 - iVar57));
          iVar56 = iVar56 + 1;
          __s = (char *)(ulong)uVar88;
          printf(" %d");
          putchar(10);
        }
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      function_tests = function_tests + 1;
      uVar88 = 0;
      iVar57 = 0;
      do {
        iVar58 = xmlMemBlocks();
        pxVar77 = gen_xmlTextReaderPtr(uVar88,(int)__s);
        pxVar80 = (xmlNodePtr)xmlTextReaderPreserve(pxVar77);
        desret_xmlNodePtr(pxVar80);
        call_tests = call_tests + 1;
        if (pxVar77 != (xmlTextReaderPtr)0x0) {
          xmlFreeTextReader(pxVar77);
        }
        xmlResetLastError();
        iVar59 = xmlMemBlocks();
        if (iVar58 != iVar59) {
          iVar59 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderPreserve",(ulong)(uint)(iVar59 - iVar58));
          iVar57 = iVar57 + 1;
          __s = (char *)(ulong)uVar88;
          printf(" %d");
          putchar(10);
        }
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      function_tests = function_tests + 1;
      iVar58 = 0;
      uVar88 = 0;
      do {
        puVar90 = &DAT_00165d70;
        uVar91 = 0;
        do {
          iVar60 = (int)__s;
          iVar59 = xmlMemBlocks();
          pxVar77 = gen_xmlTextReaderPtr(uVar88,iVar60);
          if (uVar91 < 4) {
            __s = (char *)*puVar90;
          }
          else {
            __s = (char *)0x0;
          }
          xmlTextReaderPreservePattern(pxVar77,__s,0);
          call_tests = call_tests + 1;
          if (pxVar77 != (xmlTextReaderPtr)0x0) {
            xmlFreeTextReader(pxVar77);
          }
          xmlResetLastError();
          iVar60 = xmlMemBlocks();
          if (iVar59 != iVar60) {
            iVar60 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlTextReaderPreservePattern",
                   (ulong)(uint)(iVar60 - iVar59));
            iVar58 = iVar58 + 1;
            printf(" %d",(ulong)uVar88);
            printf(" %d");
            __s = (char *)0x0;
            printf(" %d");
            putchar(10);
          }
          uVar91 = uVar91 + 1;
          puVar90 = puVar90 + 1;
        } while (uVar91 != 5);
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      function_tests = function_tests + 1;
      uVar88 = 0;
      iVar59 = 0;
      do {
        iVar60 = xmlMemBlocks();
        pxVar77 = gen_xmlTextReaderPtr(uVar88,(int)__s);
        xmlTextReaderQuoteChar(pxVar77);
        call_tests = call_tests + 1;
        if (pxVar77 != (xmlTextReaderPtr)0x0) {
          xmlFreeTextReader(pxVar77);
        }
        xmlResetLastError();
        iVar61 = xmlMemBlocks();
        if (iVar60 != iVar61) {
          iVar61 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderQuoteChar",(ulong)(uint)(iVar61 - iVar60))
          ;
          iVar59 = iVar59 + 1;
          __s = (char *)(ulong)uVar88;
          printf(" %d");
          putchar(10);
        }
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      function_tests = function_tests + 1;
      uVar88 = 0;
      iVar60 = 0;
      do {
        iVar61 = xmlMemBlocks();
        pxVar77 = gen_xmlTextReaderPtr(uVar88,(int)__s);
        xmlTextReaderRead(pxVar77);
        call_tests = call_tests + 1;
        if (pxVar77 != (xmlTextReaderPtr)0x0) {
          xmlFreeTextReader(pxVar77);
        }
        xmlResetLastError();
        iVar62 = xmlMemBlocks();
        if (iVar61 != iVar62) {
          iVar62 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderRead",(ulong)(uint)(iVar62 - iVar61));
          iVar60 = iVar60 + 1;
          __s = (char *)(ulong)uVar88;
          printf(" %d");
          putchar(10);
        }
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      function_tests = function_tests + 1;
      uVar88 = 0;
      iVar61 = 0;
      do {
        iVar62 = xmlMemBlocks();
        pxVar77 = gen_xmlTextReaderPtr(uVar88,(int)__s);
        xmlTextReaderReadAttributeValue(pxVar77);
        call_tests = call_tests + 1;
        if (pxVar77 != (xmlTextReaderPtr)0x0) {
          xmlFreeTextReader(pxVar77);
        }
        xmlResetLastError();
        iVar63 = xmlMemBlocks();
        if (iVar62 != iVar63) {
          iVar63 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderReadAttributeValue",
                 (ulong)(uint)(iVar63 - iVar62));
          iVar61 = iVar61 + 1;
          __s = (char *)(ulong)uVar88;
          printf(" %d");
          putchar(10);
        }
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      function_tests = function_tests + 1;
      uVar88 = 0;
      iVar62 = 0;
      do {
        iVar63 = xmlMemBlocks();
        pxVar77 = gen_xmlTextReaderPtr(uVar88,(int)__s);
        xmlTextReaderReadState(pxVar77);
        call_tests = call_tests + 1;
        if (pxVar77 != (xmlTextReaderPtr)0x0) {
          xmlFreeTextReader(pxVar77);
        }
        xmlResetLastError();
        iVar64 = xmlMemBlocks();
        if (iVar63 != iVar64) {
          iVar64 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderReadState",(ulong)(uint)(iVar64 - iVar63))
          ;
          iVar62 = iVar62 + 1;
          __s = (char *)(ulong)uVar88;
          printf(" %d");
          putchar(10);
        }
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      function_tests = function_tests + 1;
      iVar63 = 0;
      iVar64 = 0;
      do {
        iVar66 = (int)__s;
        iVar65 = xmlMemBlocks();
        pxVar77 = gen_xmlTextReaderPtr(iVar64,iVar66);
        __s = (char *)0x0;
        xmlTextReaderRelaxNGSetSchema(pxVar77);
        call_tests = call_tests + 1;
        if (pxVar77 != (xmlTextReaderPtr)0x0) {
          xmlFreeTextReader(pxVar77);
        }
        xmlResetLastError();
        iVar66 = xmlMemBlocks();
        if (iVar65 != iVar66) {
          iVar66 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderRelaxNGSetSchema",
                 (ulong)(uint)(iVar66 - iVar65));
          iVar63 = iVar63 + 1;
          printf(" %d");
          __s = (char *)0x0;
          printf(" %d");
          putchar(10);
        }
        iVar64 = iVar64 + 1;
      } while (iVar64 != 4);
      function_tests = function_tests + 1;
      iVar64 = 0;
      uVar88 = 0;
      do {
        puVar90 = &DAT_00165d58;
        pxVar78 = (xmlDocPtr)0x0;
        do {
          iVar66 = (int)__s;
          iVar65 = xmlMemBlocks();
          pxVar77 = gen_xmlTextReaderPtr(uVar88,iVar66);
          uVar91 = (uint)pxVar78;
          if (uVar91 < 3) {
            __s = (char *)*puVar90;
          }
          else {
            __s = (char *)0x0;
          }
          xmlTextReaderRelaxNGValidate(pxVar77);
          call_tests = call_tests + 1;
          if (pxVar77 != (xmlTextReaderPtr)0x0) {
            xmlFreeTextReader(pxVar77);
          }
          xmlResetLastError();
          iVar66 = xmlMemBlocks();
          if (iVar65 != iVar66) {
            iVar66 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlTextReaderRelaxNGValidate",
                   (ulong)(uint)(iVar66 - iVar65));
            iVar64 = iVar64 + 1;
            printf(" %d",(ulong)uVar88);
            printf(" %d");
            putchar(10);
            __s = (char *)pxVar78;
          }
          uVar91 = uVar91 + 1;
          pxVar78 = (xmlDocPtr)(ulong)uVar91;
          puVar90 = puVar90 + 1;
        } while (uVar91 != 4);
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      function_tests = function_tests + 1;
      iVar65 = 0;
      uVar88 = 0;
      do {
        puVar86 = &DAT_00163444;
        pxVar78 = (xmlDocPtr)0x0;
        do {
          iVar67 = (int)__s;
          iVar66 = xmlMemBlocks();
          pxVar77 = gen_xmlTextReaderPtr(uVar88,iVar67);
          uVar92 = 0x200;
          uVar91 = (uint)pxVar78;
          if (uVar91 < 4) {
            uVar92 = *puVar86;
          }
          __s = (char *)0x0;
          xmlTextReaderRelaxNGValidateCtxt(pxVar77,0,uVar92);
          call_tests = call_tests + 1;
          if (pxVar77 != (xmlTextReaderPtr)0x0) {
            xmlFreeTextReader(pxVar77);
          }
          xmlResetLastError();
          iVar67 = xmlMemBlocks();
          if (iVar66 != iVar67) {
            iVar67 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlTextReaderRelaxNGValidateCtxt",
                   (ulong)(uint)(iVar67 - iVar66));
            iVar65 = iVar65 + 1;
            printf(" %d",(ulong)uVar88);
            printf(" %d",0);
            printf(" %d");
            putchar(10);
            __s = (char *)pxVar78;
          }
          uVar91 = uVar91 + 1;
          pxVar78 = (xmlDocPtr)(ulong)uVar91;
          puVar86 = puVar86 + 1;
        } while (uVar91 != 5);
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      function_tests = function_tests + 1;
      iVar66 = 0;
      do {
        puVar90 = &DAT_00165d58;
        uVar88 = 0;
        do {
          pxVar77 = gen_xmlTextReaderPtr(iVar66,(int)__s);
          if (uVar88 < 3) {
            __s = (char *)*puVar90;
          }
          else {
            __s = (char *)0x0;
          }
          xmlTextReaderSchemaValidate(pxVar77);
          call_tests = call_tests + 1;
          if (pxVar77 != (xmlTextReaderPtr)0x0) {
            xmlFreeTextReader(pxVar77);
          }
          xmlResetLastError();
          uVar88 = uVar88 + 1;
          puVar90 = puVar90 + 1;
        } while (uVar88 != 4);
        iVar66 = iVar66 + 1;
      } while (iVar66 != 4);
      function_tests = function_tests + 1;
      iVar66 = 0;
      uVar88 = 0;
      do {
        puVar86 = &DAT_00163444;
        pxVar78 = (xmlDocPtr)0x0;
        do {
          iVar68 = (int)__s;
          iVar67 = xmlMemBlocks();
          pxVar77 = gen_xmlTextReaderPtr(uVar88,iVar68);
          uVar92 = 0x200;
          uVar91 = (uint)pxVar78;
          if (uVar91 < 4) {
            uVar92 = *puVar86;
          }
          __s = (char *)0x0;
          xmlTextReaderSchemaValidateCtxt(pxVar77,0,uVar92);
          call_tests = call_tests + 1;
          if (pxVar77 != (xmlTextReaderPtr)0x0) {
            xmlFreeTextReader(pxVar77);
          }
          xmlResetLastError();
          iVar68 = xmlMemBlocks();
          if (iVar67 != iVar68) {
            iVar68 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlTextReaderSchemaValidateCtxt",
                   (ulong)(uint)(iVar68 - iVar67));
            iVar66 = iVar66 + 1;
            printf(" %d",(ulong)uVar88);
            printf(" %d",0);
            printf(" %d");
            putchar(10);
            __s = (char *)pxVar78;
          }
          uVar91 = uVar91 + 1;
          pxVar78 = (xmlDocPtr)(ulong)uVar91;
          puVar86 = puVar86 + 1;
        } while (uVar91 != 5);
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      function_tests = function_tests + 1;
      iVar67 = 0;
      uVar88 = 0;
      do {
        uVar91 = 0;
        do {
          pxVar78 = (xmlDocPtr)0x0;
          puVar86 = &DAT_00163454;
          do {
            iVar69 = (int)__s;
            iVar68 = xmlMemBlocks();
            pxVar77 = gen_xmlTextReaderPtr(uVar88,iVar69);
            uVar92 = 0xffffffff;
            __s = (char *)0xffffffff;
            if (uVar91 < 4) {
              __s = (char *)(ulong)(uint)(&DAT_00163454)[uVar91];
            }
            uVar84 = (uint)pxVar78;
            if (uVar84 < 4) {
              uVar92 = *puVar86;
            }
            xmlTextReaderSetParserProp(pxVar77,__s,uVar92);
            call_tests = call_tests + 1;
            if (pxVar77 != (xmlTextReaderPtr)0x0) {
              xmlFreeTextReader(pxVar77);
            }
            xmlResetLastError();
            iVar69 = xmlMemBlocks();
            if (iVar68 != iVar69) {
              iVar69 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlTextReaderSetParserProp",
                     (ulong)(uint)(iVar69 - iVar68));
              iVar67 = iVar67 + 1;
              printf(" %d",(ulong)uVar88);
              printf(" %d",(ulong)uVar91);
              printf(" %d");
              putchar(10);
              __s = (char *)pxVar78;
            }
            uVar84 = uVar84 + 1;
            pxVar78 = (xmlDocPtr)(ulong)uVar84;
            puVar86 = puVar86 + 1;
          } while (uVar84 != 4);
          uVar91 = uVar91 + 1;
        } while (uVar91 != 4);
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      function_tests = function_tests + 1;
      iVar68 = 0;
      iVar69 = 0;
      do {
        iVar71 = (int)__s;
        iVar70 = xmlMemBlocks();
        pxVar77 = gen_xmlTextReaderPtr(iVar69,iVar71);
        __s = (char *)0x0;
        xmlTextReaderSetSchema(pxVar77);
        call_tests = call_tests + 1;
        if (pxVar77 != (xmlTextReaderPtr)0x0) {
          xmlFreeTextReader(pxVar77);
        }
        xmlResetLastError();
        iVar71 = xmlMemBlocks();
        if (iVar70 != iVar71) {
          iVar71 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderSetSchema",(ulong)(uint)(iVar71 - iVar70))
          ;
          iVar68 = iVar68 + 1;
          printf(" %d");
          __s = (char *)0x0;
          printf(" %d");
          putchar(10);
        }
        iVar69 = iVar69 + 1;
      } while (iVar69 != 4);
      function_tests = function_tests + 1;
      iVar69 = 0;
      uVar88 = 0;
      do {
        uVar91 = 0;
        do {
          uVar89 = 0;
          do {
            uVar84 = 0;
            do {
              pxVar78 = (xmlDocPtr)0x0;
              puVar86 = &DAT_00163444;
              do {
                iVar71 = (int)__s;
                iVar70 = xmlMemBlocks();
                pxVar77 = gen_xmlTextReaderPtr(uVar88,iVar71);
                __s = (char *)gen_xmlParserInputBufferPtr(uVar91,iVar71);
                if ((uint)uVar89 < 7) {
                  uVar75 = (&DAT_00165d90)[uVar89];
                }
                else {
                  uVar75 = 0;
                }
                if (uVar84 < 3) {
                  uVar82 = (&DAT_00165d58)[uVar84];
                }
                else {
                  uVar82 = 0;
                }
                uVar92 = 0x200;
                uVar93 = (uint)pxVar78;
                if (uVar93 < 4) {
                  uVar92 = *puVar86;
                }
                xmlTextReaderSetup(pxVar77,__s,uVar75,uVar82,uVar92);
                call_tests = call_tests + 1;
                if (pxVar77 != (xmlTextReaderPtr)0x0) {
                  xmlFreeTextReader(pxVar77);
                }
                xmlResetLastError();
                iVar71 = xmlMemBlocks();
                if (iVar70 != iVar71) {
                  iVar71 = xmlMemBlocks();
                  printf("Leak of %d blocks found in xmlTextReaderSetup",
                         (ulong)(uint)(iVar71 - iVar70));
                  iVar69 = iVar69 + 1;
                  printf(" %d",(ulong)uVar88);
                  printf(" %d",(ulong)uVar91);
                  printf(" %d",uVar89);
                  printf(" %d",(ulong)uVar84);
                  printf(" %d");
                  putchar(10);
                  __s = (char *)pxVar78;
                }
                uVar93 = uVar93 + 1;
                pxVar78 = (xmlDocPtr)(ulong)uVar93;
                puVar86 = puVar86 + 1;
              } while (uVar93 != 5);
              uVar84 = uVar84 + 1;
            } while (uVar84 != 4);
            uVar84 = (uint)uVar89 + 1;
            uVar89 = (ulong)uVar84;
          } while (uVar84 != 8);
          uVar91 = uVar91 + 1;
        } while (uVar91 != 8);
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      function_tests = function_tests + 1;
      uVar88 = 0;
      local_80 = 0;
      do {
        iVar70 = xmlMemBlocks();
        pxVar77 = gen_xmlTextReaderPtr(uVar88,(int)__s);
        xmlTextReaderStandalone(pxVar77);
        call_tests = call_tests + 1;
        if (pxVar77 != (xmlTextReaderPtr)0x0) {
          xmlFreeTextReader(pxVar77);
        }
        xmlResetLastError();
        iVar71 = xmlMemBlocks();
        if (iVar70 != iVar71) {
          iVar71 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderStandalone",(ulong)(uint)(iVar71 - iVar70)
                );
          local_80 = local_80 + 1;
          __s = (char *)(ulong)uVar88;
          printf(" %d");
          putchar(10);
        }
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      function_tests = function_tests + 1;
      uVar88 = 0;
      iVar70 = 0;
      do {
        iVar71 = xmlMemBlocks();
        pxVar77 = gen_xmlTextReaderPtr(uVar88,(int)__s);
        lVar79 = xmlTextReaderValue(pxVar77);
        if (lVar79 != 0) {
          (*_xmlFree)(lVar79);
        }
        call_tests = call_tests + 1;
        if (pxVar77 != (xmlTextReaderPtr)0x0) {
          xmlFreeTextReader(pxVar77);
        }
        xmlResetLastError();
        iVar72 = xmlMemBlocks();
        if (iVar71 != iVar72) {
          iVar72 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderValue",(ulong)(uint)(iVar72 - iVar71));
          iVar70 = iVar70 + 1;
          __s = (char *)(ulong)uVar88;
          printf(" %d");
          putchar(10);
        }
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      function_tests = function_tests + 1;
      uVar88 = 0;
      iVar71 = 0;
      do {
        iVar72 = xmlMemBlocks();
        pxVar77 = gen_xmlTextReaderPtr(uVar88,(int)__s);
        lVar79 = xmlTextReaderXmlLang(pxVar77);
        if (lVar79 != 0) {
          (*_xmlFree)(lVar79);
        }
        call_tests = call_tests + 1;
        if (pxVar77 != (xmlTextReaderPtr)0x0) {
          xmlFreeTextReader(pxVar77);
        }
        xmlResetLastError();
        iVar73 = xmlMemBlocks();
        if (iVar72 != iVar73) {
          iVar73 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderXmlLang",(ulong)(uint)(iVar73 - iVar72));
          iVar71 = iVar71 + 1;
          __s = (char *)(ulong)uVar88;
          printf(" %d");
          putchar(10);
        }
        uVar88 = uVar88 + 1;
      } while (uVar88 != 4);
      function_tests = function_tests + 1;
      uVar88 = iVar1 + iVar4 + local_3c + local_40 + local_5c + iVar5 + iVar6 + iVar7 + iVar8 +
               iVar9 + iVar10 + iVar11 + iVar12 + iVar13 + iVar14 + iVar15 + iVar16 + iVar17 +
               iVar18 + iVar19 + iVar20 + iVar21 + iVar22 + iVar23 + iVar24 + iVar25 + iVar26 +
               iVar27 + iVar29 + iVar28 + iVar30 + iVar31 + iVar32 + iVar33 + iVar34 + iVar35 +
               iVar36 + iVar37 + iVar38 + iVar39 + (uint)(iVar40 != iVar41) +
               (uint)(iVar42 != iVar43) + iVar2 + iVar44 + iVar45 + iVar46 + iVar47 + iVar48 +
               iVar49 + iVar50 + iVar51 + iVar52 + iVar53 + iVar54 + iVar55 + iVar56 + iVar57 +
               iVar58 + iVar59 + iVar60 + iVar61 + iVar62 + iVar63 + iVar64 + iVar65 + iVar66 +
               iVar67 + iVar68 + iVar69 + local_80 + iVar70 + iVar71;
      if (uVar88 != 0) {
        printf("Module xmlreader: %d errors\n",(ulong)uVar88);
      }
      return uVar88;
    }
  } while( true );
}

Assistant:

static int
test_xmlreader(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing xmlreader : 76 of 86 functions ...\n");
    test_ret += test_xmlNewTextReader();
    test_ret += test_xmlNewTextReaderFilename();
    test_ret += test_xmlReaderForDoc();
    test_ret += test_xmlReaderForFile();
    test_ret += test_xmlReaderForMemory();
    test_ret += test_xmlReaderNewDoc();
    test_ret += test_xmlReaderNewFile();
    test_ret += test_xmlReaderNewMemory();
    test_ret += test_xmlReaderNewWalker();
    test_ret += test_xmlReaderWalker();
    test_ret += test_xmlTextReaderAttributeCount();
    test_ret += test_xmlTextReaderBaseUri();
    test_ret += test_xmlTextReaderByteConsumed();
    test_ret += test_xmlTextReaderClose();
    test_ret += test_xmlTextReaderConstBaseUri();
    test_ret += test_xmlTextReaderConstEncoding();
    test_ret += test_xmlTextReaderConstLocalName();
    test_ret += test_xmlTextReaderConstName();
    test_ret += test_xmlTextReaderConstNamespaceUri();
    test_ret += test_xmlTextReaderConstPrefix();
    test_ret += test_xmlTextReaderConstString();
    test_ret += test_xmlTextReaderConstValue();
    test_ret += test_xmlTextReaderConstXmlLang();
    test_ret += test_xmlTextReaderConstXmlVersion();
    test_ret += test_xmlTextReaderCurrentDoc();
    test_ret += test_xmlTextReaderCurrentNode();
    test_ret += test_xmlTextReaderDepth();
    test_ret += test_xmlTextReaderExpand();
    test_ret += test_xmlTextReaderGetAttribute();
    test_ret += test_xmlTextReaderGetAttributeNo();
    test_ret += test_xmlTextReaderGetAttributeNs();
    test_ret += test_xmlTextReaderGetErrorHandler();
    test_ret += test_xmlTextReaderGetParserColumnNumber();
    test_ret += test_xmlTextReaderGetParserLineNumber();
    test_ret += test_xmlTextReaderGetParserProp();
    test_ret += test_xmlTextReaderGetRemainder();
    test_ret += test_xmlTextReaderHasAttributes();
    test_ret += test_xmlTextReaderHasValue();
    test_ret += test_xmlTextReaderIsDefault();
    test_ret += test_xmlTextReaderIsEmptyElement();
    test_ret += test_xmlTextReaderIsNamespaceDecl();
    test_ret += test_xmlTextReaderIsValid();
    test_ret += test_xmlTextReaderLocalName();
    test_ret += test_xmlTextReaderLocatorBaseURI();
    test_ret += test_xmlTextReaderLocatorLineNumber();
    test_ret += test_xmlTextReaderLookupNamespace();
    test_ret += test_xmlTextReaderMoveToAttribute();
    test_ret += test_xmlTextReaderMoveToAttributeNo();
    test_ret += test_xmlTextReaderMoveToAttributeNs();
    test_ret += test_xmlTextReaderMoveToElement();
    test_ret += test_xmlTextReaderMoveToFirstAttribute();
    test_ret += test_xmlTextReaderMoveToNextAttribute();
    test_ret += test_xmlTextReaderName();
    test_ret += test_xmlTextReaderNamespaceUri();
    test_ret += test_xmlTextReaderNext();
    test_ret += test_xmlTextReaderNextSibling();
    test_ret += test_xmlTextReaderNodeType();
    test_ret += test_xmlTextReaderNormalization();
    test_ret += test_xmlTextReaderPrefix();
    test_ret += test_xmlTextReaderPreserve();
    test_ret += test_xmlTextReaderPreservePattern();
    test_ret += test_xmlTextReaderQuoteChar();
    test_ret += test_xmlTextReaderRead();
    test_ret += test_xmlTextReaderReadAttributeValue();
    test_ret += test_xmlTextReaderReadState();
    test_ret += test_xmlTextReaderRelaxNGSetSchema();
    test_ret += test_xmlTextReaderRelaxNGValidate();
    test_ret += test_xmlTextReaderRelaxNGValidateCtxt();
    test_ret += test_xmlTextReaderSchemaValidate();
    test_ret += test_xmlTextReaderSchemaValidateCtxt();
    test_ret += test_xmlTextReaderSetErrorHandler();
    test_ret += test_xmlTextReaderSetParserProp();
    test_ret += test_xmlTextReaderSetSchema();
    test_ret += test_xmlTextReaderSetStructuredErrorHandler();
    test_ret += test_xmlTextReaderSetup();
    test_ret += test_xmlTextReaderStandalone();
    test_ret += test_xmlTextReaderValue();
    test_ret += test_xmlTextReaderXmlLang();

    if (test_ret != 0)
	printf("Module xmlreader: %d errors\n", test_ret);
    return(test_ret);
}